

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
CLI::ConfigBase::from_config
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          ConfigBase *this,istream *input)

{
  char cVar1;
  byte closure_char;
  short sVar2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  size_t __n;
  pointer pcVar4;
  pointer pCVar5;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *pvVar6;
  ConfigBase *pCVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  int iVar11;
  istream *piVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var16;
  undefined8 uVar17;
  pointer pbVar18;
  pointer extraout_RAX;
  undefined8 in_R8;
  undefined7 uVar19;
  uint uVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it_4;
  size_t start;
  pointer str;
  pointer pCVar21;
  bool bVar22;
  bool bVar23;
  string l2;
  string item;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *output;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  string line;
  string currentSection;
  string name;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it_1;
  string buffer;
  string previousSection;
  string line_sep_chars;
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [12];
  uint local_2cc;
  undefined1 local_2c8 [17];
  undefined7 uStack_2b7;
  undefined8 uStack_2b0;
  undefined1 local_2a8 [8];
  ConfigBase *local_2a0;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *local_298;
  uint local_28c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  undefined1 local_268 [44];
  uint local_23c;
  undefined1 local_238 [32];
  uint local_218;
  int local_214;
  string local_210;
  string local_1f0;
  undefined1 *local_1d0;
  pointer local_1c8;
  uint local_1c0;
  int local_1bc;
  pointer local_1b8;
  pointer local_1b0;
  undefined1 local_1a8 [24];
  string local_190;
  undefined1 *local_170;
  char *local_168;
  undefined1 local_160 [16];
  undefined1 local_150 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  undefined1 local_120 [32];
  char local_100 [16];
  char *local_f0;
  undefined8 local_e8;
  char local_e0;
  char local_df;
  char local_de;
  undefined1 local_dd;
  undefined1 local_d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [3];
  
  local_238._0_8_ = local_238 + 0x10;
  local_238._8_8_ = 0;
  local_238[0x10] = '\0';
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  local_190._M_string_length = 0;
  local_190.field_2._M_local_buf[0] = '\0';
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  local_298 = __return_storage_ptr__;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"default","");
  local_170 = local_160;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"default","");
  (local_298->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_298->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_298->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar1 = this->arrayStart;
  local_1a8._20_4_ = SEXT14(cVar1);
  cVar8 = this->arrayEnd;
  if (cVar8 == ']' && cVar1 == '[') {
    bVar22 = this->arraySeparator == ',';
    uVar19 = (undefined7)((ulong)in_R8 >> 8);
  }
  else {
    bVar22 = false;
    uVar19 = 0;
  }
  local_1bc = (int)cVar8;
  bVar23 = (local_1a8._20_4_ & 0xdf) == 0;
  local_218 = (uint)(byte)this->arraySeparator;
  uVar20 = 0x2c;
  if (this->arraySeparator != 0x20) {
    uVar20 = local_218;
  }
  if (bVar23 && cVar1 == cVar8) {
    local_1a8._20_4_ = 0x5b;
    local_1bc = 0x5d;
    local_218 = uVar20;
  }
  local_e0 = this->parentSeparatorChar;
  local_df = this->commentChar;
  local_de = this->valueDelimiter;
  local_f0 = &local_e0;
  local_e8 = 3;
  local_dd = 0;
  local_1c0 = (uint)CONCAT71(uVar19,bVar22 | (bVar23 && cVar1 == cVar8));
  local_214 = 0;
  local_23c = 0;
  local_2a0 = this;
  do {
    cVar1 = (char)input;
    cVar8 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + cVar1);
    piVar12 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                        (input,(string *)(local_1a8 + 0x18),cVar8);
    if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) {
      iVar11 = ::std::__cxx11::string::compare((char *)&local_210);
      if (iVar11 != 0) {
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        local_1f0._M_string_length = 0;
        local_1f0.field_2._M_local_buf[0] = '\0';
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>(local_298);
        detail::generate_parents
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2f8,&local_210,&local_1f0,local_2a0->parentSeparatorChar);
        pvVar6 = local_298;
        pCVar21 = (local_298->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_2c8._0_8_ =
             pCVar21[-1].parents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_2c8._8_8_ =
             pCVar21[-1].parents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        unique0x00012000 =
             pCVar21[-1].parents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pCVar21[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2f8._0_8_;
        pCVar21[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2f8._8_8_;
        pCVar21[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2f8._16_8_;
        local_2f8._0_8_ = (pointer)0x0;
        local_2f8._8_8_ = (pointer)0x0;
        local_2f8._16_8_ = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2f8);
        pCVar21 = (pvVar6->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        ::std::__cxx11::string::_M_replace
                  ((ulong)&pCVar21[-1].name,0,(char *)pCVar21[-1].name._M_string_length,0x1442dc);
        pCVar21 = (pvVar6->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        uVar14 = (long)pCVar21[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)pCVar21[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        while (0x20 < uVar14) {
          std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::push_back
                    (pvVar6,pCVar21 + -1);
          pCVar21 = (pvVar6->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          pbVar18 = pCVar21[-1].parents.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pCVar21[-1].parents.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar18 + -1;
          pcVar4 = pbVar18[-1]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 != &pbVar18[-1].field_2) {
            operator_delete(pcVar4);
          }
          pCVar21 = (local_298->
                    super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          pvVar6 = local_298;
          uVar14 = (long)pCVar21[-1].parents.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)pCVar21[-1].parents.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0);
      }
      if (local_170 != local_160) {
        operator_delete(local_170);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      if ((pointer)local_238._0_8_ != (pointer)(local_238 + 0x10)) {
        operator_delete((void *)local_238._0_8_);
      }
      return local_298;
    }
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    local_1f0._M_string_length = 0;
    local_1f0.field_2._M_local_buf[0] = '\0';
    detail::trim_copy((string *)local_2c8,(string *)(local_1a8 + 0x18));
    ::std::__cxx11::string::operator=((string *)local_238,(string *)local_2c8);
    if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
      operator_delete((void *)local_2c8._0_8_);
    }
    if (2 < (ulong)local_238._8_8_) {
      iVar11 = ::std::__cxx11::string::compare((ulong)local_238,0,(char *)0x3);
      if ((iVar11 == 0) ||
         (iVar11 = ::std::__cxx11::string::compare((ulong)local_238,0,(char *)0x3), iVar11 == 0)) {
        cVar8 = *(char *)local_238._0_8_;
        bVar22 = true;
        do {
          cVar9 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + cVar1);
          piVar12 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                              (input,(string *)local_238,cVar9);
          if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) break;
          local_2c8._0_8_ = local_238._0_8_ + local_238._8_8_;
          local_2f8._0_8_ = local_238._0_8_;
          ::std::
          __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    (local_268,(string *)local_2c8,local_2f8);
          local_238._8_8_ = local_268._0_8_ - local_238._0_8_;
          *(char *)local_268._0_8_ = '\0';
          _Var16 = ::std::
                   __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                             ();
          if ((char *)(local_238._0_8_ + local_238._8_8_) == _Var16._M_current) {
            local_238._8_8_ = 0;
            *(char *)local_238._0_8_ = '\0';
          }
          else {
            ::std::__cxx11::string::_M_erase((ulong)local_238,0);
          }
          if ((((2 < (ulong)local_238._8_8_) &&
               (*(char *)(local_238._0_8_ + (local_238._8_8_ - 1)) == cVar8)) &&
              (*(char *)(local_238._0_8_ + (local_238._8_8_ - 2)) == cVar8)) &&
             (*(char *)(local_238._0_8_ + (local_238._8_8_ - 3)) == cVar8)) {
            bVar22 = false;
          }
        } while (bVar22);
      }
      else {
        cVar8 = *(char *)local_238._0_8_;
        if ((cVar8 != '#') && (cVar8 != ';')) {
          if ((cVar8 == '[') && (*(char *)(local_238._0_8_ + (local_238._8_8_ - 1)) == ']')) {
            iVar11 = ::std::__cxx11::string::compare((char *)&local_210);
            if (iVar11 != 0) {
              std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                        (local_298);
              detail::generate_parents
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2f8,&local_210,&local_1f0,local_2a0->parentSeparatorChar);
              pvVar6 = local_298;
              pCVar21 = (local_298->
                        super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
              local_2c8._0_8_ =
                   pCVar21[-1].parents.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_2c8._8_8_ =
                   pCVar21[-1].parents.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              unique0x00012000 =
                   pCVar21[-1].parents.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pCVar21[-1].parents.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2f8._0_8_;
              pCVar21[-1].parents.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2f8._8_8_;
              pCVar21[-1].parents.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2f8._16_8_;
              local_2f8._0_8_ = (pointer)0x0;
              local_2f8._8_8_ = (pointer)0x0;
              local_2f8._16_8_ = (pointer)0x0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_2c8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_2f8);
              pCVar21 = (pvVar6->
                        super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
              ::std::__cxx11::string::_M_replace
                        ((ulong)&pCVar21[-1].name,0,(char *)pCVar21[-1].name._M_string_length,
                         0x1442dc);
            }
            ::std::__cxx11::string::substr((ulong)local_2c8,(ulong)local_238);
            ::std::__cxx11::string::operator=((string *)&local_210,(string *)local_2c8);
            if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
              operator_delete((void *)local_2c8._0_8_);
            }
            if ((((char *)0x1 < local_210._M_string_length) && (*local_210._M_dataplus._M_p == '['))
               && ((local_210._M_dataplus._M_p + -1)[local_210._M_string_length] == ']')) {
              ::std::__cxx11::string::substr((ulong)local_2c8,(ulong)&local_210);
              ::std::__cxx11::string::operator=((string *)&local_210,(string *)local_2c8);
              if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
                operator_delete((void *)local_2c8._0_8_);
              }
            }
            local_1b8 = (pointer)local_1a8;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1b8,local_210._M_dataplus._M_p,
                       (char *)(local_210._M_string_length + (long)local_210._M_dataplus._M_p));
            ::std::
            transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                      (local_1b8,
                       (char *)((long)&(local_1b0->_M_dataplus)._M_p + (long)&local_1b8->_M_dataplus
                               ),local_1b8);
            if (local_1b8 == (pointer)local_1a8) {
              uStack_2b0 = local_1a8._8_8_;
              local_2c8._0_8_ = (pointer)(local_2c8 + 0x10);
            }
            else {
              local_2c8._0_8_ = local_1b8;
            }
            uStack_2b7 = local_1a8._1_7_;
            local_2c8[0x10] = local_1a8[0];
            local_2c8._8_8_ = local_1b0;
            local_1b0 = (pointer)0x0;
            local_1a8[0] = 0;
            local_1b8 = (pointer)local_1a8;
            iVar11 = ::std::__cxx11::string::compare((char *)local_2c8);
            if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
              operator_delete((void *)local_2c8._0_8_);
            }
            if (local_1b8 != (pointer)local_1a8) {
              operator_delete(local_1b8);
            }
            if (iVar11 == 0) {
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_210,0,(char *)local_210._M_string_length,0x144524);
            }
            else {
              detail::checkParentSegments(local_298,&local_210,local_2a0->parentSeparatorChar);
            }
            if (((char *)local_210._M_string_length == local_168) &&
               (((char *)local_210._M_string_length == (char *)0x0 ||
                (iVar11 = bcmp(local_210._M_dataplus._M_p,local_170,local_210._M_string_length),
                iVar11 == 0)))) {
              local_214 = local_214 + 1;
              local_23c = 0;
            }
            else {
              local_214 = 0;
              ::std::__cxx11::string::_M_assign((string *)&local_170);
              local_23c = 0;
            }
          }
          else if (cVar8 != local_2a0->commentChar) {
            lVar13 = ::std::__cxx11::string::find_first_of((char *)local_238,0x14797b,0);
            if (lVar13 != -1) {
              start = 0;
              do {
                if ((ulong)local_238._8_8_ <= start) break;
                closure_char = *(byte *)(local_238._0_8_ + start);
                if ((closure_char - 0x22 < 0x3f) &&
                   ((0x4000000000000021U >> ((ulong)(closure_char - 0x22) & 0x3f) & 1) != 0)) {
                  start = detail::close_sequence((string *)local_238,start,closure_char);
LAB_00113326:
                  start = start + 1;
LAB_00113329:
                  bVar22 = true;
                }
                else {
                  if ((closure_char != local_2a0->valueDelimiter) &&
                     (closure_char != local_2a0->commentChar)) {
                    if (((closure_char == 9) || (closure_char == 0x20)) ||
                       (closure_char == local_2a0->parentSeparatorChar)) goto LAB_00113326;
                    start = ::std::__cxx11::string::find_first_of
                                      ((char *)local_238,(ulong)local_f0,start);
                    goto LAB_00113329;
                  }
                  start = start - 1;
                  bVar22 = false;
                }
              } while (bVar22);
            }
            pCVar7 = local_2a0;
            cVar8 = (char)(string *)local_238;
            uVar14 = ::std::__cxx11::string::find(cVar8,(ulong)(uint)(int)local_2a0->valueDelimiter)
            ;
            uVar15 = ::std::__cxx11::string::find(cVar8,(ulong)(uint)(int)pCVar7->commentChar);
            if (uVar14 == 0xffffffffffffffff || uVar15 < uVar14) {
              ::std::__cxx11::string::substr((ulong)local_2f8,(ulong)local_238);
              detail::trim_copy((string *)local_2c8,(string *)local_2f8);
              ::std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_2c8);
              if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
                operator_delete((void *)local_2c8._0_8_);
              }
              if ((pointer)local_2f8._0_8_ != (pointer)(local_2f8 + 0x10)) {
                operator_delete((void *)local_2f8._0_8_);
              }
              local_2c8._0_8_ = local_2c8 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"true","");
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_assign_aux<std::__cxx11::string_const*>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_288,(string *)local_2c8,local_2a8);
            }
            else {
              ::std::__cxx11::string::substr((ulong)local_2f8,(ulong)local_238);
              detail::trim_copy((string *)local_2c8,(string *)local_2f8);
              ::std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_2c8);
              if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
                operator_delete((void *)local_2c8._0_8_);
              }
              if ((pointer)local_2f8._0_8_ != (pointer)(local_2f8 + 0x10)) {
                operator_delete((void *)local_2f8._0_8_);
              }
              ::std::__cxx11::string::substr((ulong)local_2f8,(ulong)local_238);
              detail::trim_copy((string *)local_2c8,(string *)local_2f8);
              if ((pointer)local_2f8._0_8_ != (pointer)(local_2f8 + 0x10)) {
                operator_delete((void *)local_2f8._0_8_);
              }
              iVar11 = ::std::__cxx11::string::compare((ulong)local_2c8,0,(char *)0x3);
              if (iVar11 == 0) {
                bVar22 = true;
              }
              else {
                iVar11 = ::std::__cxx11::string::compare((ulong)local_2c8,0,(char *)0x3);
                bVar22 = iVar11 == 0;
              }
              if (!(bool)(uVar15 == 0xffffffffffffffff | bVar22)) {
                local_120._16_8_ = local_100;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)(local_120 + 0x10),local_2c8._0_8_,
                           (char *)(local_2c8._0_8_ + (long)(_Alloc_hider *)local_2c8._8_8_));
                detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_268,(string *)(local_120 + 0x10),local_2a0->commentChar);
                if ((char *)local_120._16_8_ != local_100) {
                  operator_delete((void *)local_120._16_8_);
                }
                detail::trim_copy((string *)local_2f8,(string *)local_268._0_8_);
                ::std::__cxx11::string::operator=((string *)local_2c8,(string *)local_2f8);
                if ((pointer)local_2f8._0_8_ != (pointer)(local_2f8 + 0x10)) {
                  operator_delete((void *)local_2f8._0_8_);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_268);
              }
              cVar8 = (char)(string *)local_2c8;
              if (bVar22) {
                cVar9 = *(char *)local_2c8._0_8_;
                ::std::__cxx11::string::substr((ulong)local_2f8,(ulong)(local_1a8 + 0x18));
                ::std::__cxx11::string::operator=((string *)local_2c8,(string *)local_2f8);
                if ((pointer)local_2f8._0_8_ != (pointer)(local_2f8 + 0x10)) {
                  operator_delete((void *)local_2f8._0_8_);
                }
                _Var16 = ::std::
                         __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                   ();
                if ((char *)(local_2c8._0_8_ + (long)(_Alloc_hider *)local_2c8._8_8_) ==
                    _Var16._M_current) {
                  local_2c8._8_8_ = (pointer)0x0;
                  *(char *)local_2c8._0_8_ = '\0';
                }
                else {
                  ::std::__cxx11::string::_M_erase((ulong)local_2c8,0);
                }
                ::std::__cxx11::string::erase((ulong)local_2c8,0);
                if (((pointer)local_2c8._8_8_ == (pointer)0x0) ||
                   (((char *)(local_2c8._0_8_ + -1))[local_2c8._8_8_] != '\\')) {
                  bVar22 = true;
                  if (((ulong)local_2c8._8_8_ < (pointer)0x3) ||
                     (((((char *)(local_2c8._0_8_ + -1))[local_2c8._8_8_] != cVar9 ||
                       (((char *)(local_2c8._0_8_ + -2))[local_2c8._8_8_] != cVar9)) ||
                      (((char *)(local_2c8._0_8_ + -3))[local_2c8._8_8_] != cVar9)))) {
                    local_2cc = 0;
                    pbVar18 = (pointer)local_2c8._8_8_;
                  }
                  else {
                    ::std::__cxx11::string::pop_back();
                    ::std::__cxx11::string::pop_back();
                    pbVar18 = (pointer)::std::__cxx11::string::pop_back();
                    if (cVar9 == '\"') {
                      detail::remove_escaped_characters((string *)local_2f8,(string *)local_2c8);
                      ::std::__cxx11::string::operator=((string *)local_2c8,(string *)local_2f8);
                      pbVar18 = (pointer)(local_2f8 + 0x10);
                      if ((pointer)local_2f8._0_8_ != pbVar18) {
                        operator_delete((void *)local_2f8._0_8_);
                        pbVar18 = extraout_RAX;
                      }
                    }
                    local_2cc = 0;
                    bVar22 = false;
                  }
                }
                else {
                  uVar17 = ::std::__cxx11::string::pop_back();
                  pbVar18 = (pointer)CONCAT71((int7)((ulong)uVar17 >> 8),1);
                  local_2cc = (uint)pbVar18;
                  bVar22 = true;
                }
                local_28c = (uint)CONCAT71((int7)((ulong)pbVar18 >> 8),1);
                do {
                  if (!bVar22) break;
                  local_2f8._0_8_ = local_2f8 + 0x10;
                  local_2f8._8_8_ = (pointer)0x0;
                  local_2f8._16_8_ = local_2f8._16_8_ & 0xffffffffffffff00;
                  cVar10 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + cVar1);
                  piVar12 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                                      (input,(string *)local_2f8,cVar10);
                  uVar20 = *(uint *)(piVar12 + *(long *)(*(long *)piVar12 + -0x18) + 0x20);
                  if ((uVar20 & 5) == 0) {
                    ::std::__cxx11::string::_M_assign((string *)local_238);
                    local_268._0_8_ = local_238._0_8_ + local_238._8_8_;
                    local_1c8 = (pointer)local_238._0_8_;
                    ::std::
                    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                              (&local_1d0,local_268,&local_1c8);
                    local_238._8_8_ = (long)local_1d0 - local_238._0_8_;
                    *local_1d0 = 0;
                    if ((((ulong)local_238._8_8_ < 3) ||
                        (*(char *)(local_238._0_8_ + (local_238._8_8_ - 1)) != cVar9)) ||
                       ((*(char *)(local_238._0_8_ + (local_238._8_8_ - 2)) != cVar9 ||
                        (*(char *)(local_238._0_8_ + (local_238._8_8_ - 3)) != cVar9)))) {
                      if ((local_2cc & 1) == 0) {
                        if (((local_28c & 1) == 0) || ((pointer)local_2c8._8_8_ != (pointer)0x0)) {
                          ::std::__cxx11::string::push_back(cVar8);
                        }
                      }
                      else {
                        local_268._0_8_ = local_2f8._0_8_ + (long)(_Alloc_hider *)local_2f8._8_8_;
                        local_1c8 = (pointer)local_2f8._0_8_;
                        ::std::
                        __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                  (&local_1d0,local_268,&local_1c8);
                        local_2f8._8_8_ = local_1d0 + -local_2f8._0_8_;
                        *local_1d0 = 0;
                        _Var16 = ::std::
                                 __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                           ();
                        if ((char *)(local_2f8._0_8_ + (long)(_Alloc_hider *)local_2f8._8_8_) ==
                            _Var16._M_current) {
                          local_2f8._8_8_ = (pointer)0x0;
                          *(char *)local_2f8._0_8_ = '\0';
                        }
                        else {
                          ::std::__cxx11::string::_M_erase((ulong)local_2f8,0);
                        }
                      }
                      if (((pointer)local_2f8._8_8_ == (pointer)0x0) ||
                         (((char *)(local_2f8._0_8_ + -1))[local_2f8._8_8_] != '\\')) {
                        local_2cc = 0;
                      }
                      else {
                        uVar17 = ::std::__cxx11::string::pop_back();
                        local_2cc = (uint)CONCAT71((int7)((ulong)uVar17 >> 8),1);
                      }
                      ::std::__cxx11::string::_M_append((char *)local_2c8,local_2f8._0_8_);
                      local_28c = 0;
                    }
                    else {
                      ::std::__cxx11::string::pop_back();
                      ::std::__cxx11::string::pop_back();
                      ::std::__cxx11::string::pop_back();
                      if ((local_2cc & 1) == 0) {
                        if (((local_28c & 1) == 0) || ((pointer)local_2c8._8_8_ != (pointer)0x0)) {
                          ::std::__cxx11::string::push_back(cVar8);
                        }
                      }
                      else {
                        _Var16 = ::std::
                                 __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                           ();
                        if ((char *)(local_238._0_8_ + local_238._8_8_) == _Var16._M_current) {
                          local_238._8_8_ = 0;
                          *(char *)local_238._0_8_ = '\0';
                        }
                        else {
                          ::std::__cxx11::string::_M_erase((ulong)local_238,0);
                        }
                      }
                      ::std::__cxx11::string::_M_append((char *)local_2c8,local_238._0_8_);
                      if (((pointer)local_2c8._8_8_ != (pointer)0x0) &&
                         (((char *)(local_2c8._0_8_ + -1))[local_2c8._8_8_] == '\n')) {
                        ::std::__cxx11::string::pop_back();
                      }
                      if (cVar9 == '\"') {
                        detail::remove_escaped_characters((string *)local_268,(string *)local_2c8);
                        ::std::__cxx11::string::operator=((string *)local_2c8,(string *)local_268);
                        if ((pointer)local_268._0_8_ != (pointer)(local_268 + 0x10)) {
                          operator_delete((void *)local_268._0_8_);
                        }
                      }
                      local_28c = 0;
                      bVar22 = false;
                    }
                  }
                  if ((pointer)local_2f8._0_8_ != (pointer)(local_2f8 + 0x10)) {
                    operator_delete((void *)local_2f8._0_8_);
                  }
                } while ((uVar20 & 5) == 0);
                local_2f8._0_8_ = local_2f8 + 0x10;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_2f8,local_2c8._0_8_,
                           (char *)(local_2c8._0_8_ + (long)(_Alloc_hider *)local_2c8._8_8_));
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_assign_aux<std::__cxx11::string_const*>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_288,local_2f8,local_2d8);
LAB_00113fa4:
                pbVar18 = (pointer)(local_2f8 + 0x10);
                uVar17 = local_2f8._0_8_;
              }
              else if (((ulong)local_2c8._8_8_ < (pointer)0x2) ||
                      (local_1a8._20_4_ != (int)*(char *)local_2c8._0_8_)) {
                if ((local_1c0 & 1) == 0) {
LAB_00113f71:
                  local_2f8._0_8_ = local_2f8 + 0x10;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_2f8,local_2c8._0_8_,
                             (char *)(local_2c8._0_8_ + (long)(_Alloc_hider *)local_2c8._8_8_));
                  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  _M_assign_aux<std::__cxx11::string_const*>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_288,local_2f8,local_2d8);
                  goto LAB_00113fa4;
                }
                cVar1 = (char)local_218;
                lVar13 = ::std::__cxx11::string::find(cVar8,(ulong)(uint)(int)(char)local_218);
                if (lVar13 == -1) {
                  if (((local_1c0 & 1) == 0) ||
                     (lVar13 = ::std::__cxx11::string::find(cVar8,0x20), lVar13 == -1))
                  goto LAB_00113f71;
                  local_150._0_8_ = local_150 + 0x10;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_150,local_2c8._0_8_,
                             (char *)(local_2c8._0_8_ + (long)(_Alloc_hider *)local_2c8._8_8_));
                  detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_268,(string *)local_150,'\0');
                  local_2f8._16_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_2f8._8_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  local_2f8._0_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_268._0_8_;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_268._8_8_;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_268._16_8_;
                  local_268._0_8_ = (pointer)0x0;
                  local_268._8_8_ = (pointer)0x0;
                  local_268._16_8_ = (pointer)0x0;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2f8);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_268);
                  pbVar18 = (pointer)(local_150 + 0x10);
                  uVar17 = local_150._0_8_;
                }
                else {
                  local_130._M_allocated_capacity = (size_type)local_120;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_130,local_2c8._0_8_,
                             (char *)(local_2c8._0_8_ + (long)(_Alloc_hider *)local_2c8._8_8_));
                  detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_268,(string *)&local_130,cVar1);
                  local_2f8._16_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_2f8._8_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  local_2f8._0_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_268._0_8_;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_268._8_8_;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_268._16_8_;
                  local_268._0_8_ = (pointer)0x0;
                  local_268._8_8_ = (pointer)0x0;
                  local_268._16_8_ = (pointer)0x0;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2f8);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_268);
                  pbVar18 = (pointer)local_120;
                  uVar17 = local_130._M_allocated_capacity;
                }
              }
              else {
                local_2f8._0_8_ = local_2f8 + 0x10;
                local_2f8._8_8_ = (pointer)0x0;
                local_2f8._16_8_ = local_2f8._16_8_ & 0xffffffffffffff00;
                while (local_1bc != ((char *)(local_2c8._0_8_ + -1))[local_2c8._8_8_]) {
                  cVar8 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + cVar1);
                  piVar12 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                                      (input,(string *)local_2f8,cVar8);
                  if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) break;
                  local_268._0_8_ = local_2f8._0_8_ + (long)(_Alloc_hider *)local_2f8._8_8_;
                  local_1c8 = (pointer)local_2f8._0_8_;
                  ::std::
                  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                            (&local_1d0,local_268,&local_1c8);
                  local_2f8._8_8_ = local_1d0 + -local_2f8._0_8_;
                  *local_1d0 = 0;
                  _Var16 = ::std::
                           __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                     ();
                  if ((char *)(local_2f8._0_8_ + (long)(_Alloc_hider *)local_2f8._8_8_) ==
                      _Var16._M_current) {
                    local_2f8._8_8_ = (pointer)0x0;
                    *(char *)local_2f8._0_8_ = '\0';
                  }
                  else {
                    ::std::__cxx11::string::_M_erase((ulong)local_2f8,0);
                  }
                  ::std::__cxx11::string::_M_append((char *)local_2c8,local_2f8._0_8_);
                }
                if ((pointer)local_2f8._0_8_ != (pointer)(local_2f8 + 0x10)) {
                  operator_delete((void *)local_2f8._0_8_);
                }
                if (local_1bc == ((char *)(local_2c8._0_8_ + -1))[local_2c8._8_8_]) {
                  ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)local_2c8);
                  detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_268,(string *)&local_b0,(char)local_218);
                  local_2f8._16_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_2f8._8_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  local_2f8._0_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_268._0_8_;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_268._8_8_;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_268._16_8_;
                  local_268._0_8_ = (pointer)0x0;
                  local_268._8_8_ = (pointer)0x0;
                  local_268._16_8_ = (pointer)0x0;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2f8);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_268);
                  pbVar18 = local_a0;
                  uVar17 = local_b0._M_allocated_capacity;
                }
                else {
                  ::std::__cxx11::string::substr((ulong)local_d0,(ulong)local_2c8);
                  detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_268,(string *)local_d0,(char)local_218);
                  local_2f8._16_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_2f8._8_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  local_2f8._0_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_268._0_8_;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_268._8_8_;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_268._16_8_;
                  local_268._0_8_ = (pointer)0x0;
                  local_268._8_8_ = (pointer)0x0;
                  local_268._16_8_ = (pointer)0x0;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2f8);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_268);
                  pbVar18 = (pointer)(local_d0 + 0x10);
                  uVar17 = local_d0._0_8_;
                }
              }
              if ((pointer)uVar17 != pbVar18) {
                operator_delete((void *)uVar17);
              }
            }
            if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
              operator_delete((void *)local_2c8._0_8_);
            }
            local_2f8._0_8_ = (pointer)0x0;
            local_2f8._8_8_ = (pointer)0x0;
            local_2f8._16_8_ = (pointer)0x0;
            detail::generate_parents
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_268,&local_210,&local_1f0,local_2a0->parentSeparatorChar);
            unique0x100034d9 = local_2f8._16_8_;
            local_2c8._8_8_ = local_2f8._8_8_;
            local_2c8._0_8_ = local_2f8._0_8_;
            local_2f8._0_8_ = local_268._0_8_;
            local_2f8._8_8_ = local_268._8_8_;
            local_2f8._16_8_ = local_268._16_8_;
            local_268._0_8_ = (pointer)0x0;
            local_268._8_8_ = (pointer)0x0;
            local_268._16_8_ = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2c8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_268);
            detail::process_quoted_string(&local_1f0,'\"','\'');
            pbVar18 = local_288.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (str = local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; uVar17 = local_2f8._0_8_,
                str != pbVar18; str = str + 1) {
              detail::process_quoted_string(str,local_2a0->stringQuote,local_2a0->literalQuote);
            }
            if ((ulong)((long)(local_2f8._8_8_ - local_2f8._0_8_) >> 5) <=
                (ulong)local_2a0->maximumLayers) {
              sVar3 = (local_2a0->configSection)._M_string_length;
              if ((sVar3 == 0) || ((local_23c & 1) != 0)) {
LAB_001140dc:
                pCVar21 = (local_298->
                          super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
                if ((local_298->
                    super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                    super__Vector_impl_data._M_start != pCVar21) {
                  bVar22 = local_2a0->allowMultipleDuplicateFields;
                  pCVar5 = pCVar21;
                  do {
                    pCVar21 = pCVar5 + -1;
                    __first1 = (pCVar21->parents).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    __last1 = pCVar5[-1].parents.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    if (((((long)__last1 - (long)__first1 == local_2f8._8_8_ - local_2f8._0_8_) &&
                         (bVar23 = ::std::__equal<false>::
                                   equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                             (__first1,__last1,
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_2f8._0_8_), bVar23)) &&
                        (sVar3 = pCVar5[-1].name._M_string_length,
                        sVar3 == local_1f0._M_string_length)) &&
                       ((sVar3 == 0 ||
                        (iVar11 = bcmp(pCVar5[-1].name._M_dataplus._M_p,local_1f0._M_dataplus._M_p,
                                       sVar3), iVar11 == 0)))) goto LAB_00114163;
                  } while ((pCVar21 !=
                            (local_298->
                            super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                            _M_impl.super__Vector_impl_data._M_start) &&
                          (pCVar5 = pCVar21, bVar22 != false));
                  pCVar21 = (local_298->
                            super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                            _M_impl.super__Vector_impl_data._M_finish;
                }
LAB_00114163:
                pvVar6 = local_298;
                if (pCVar21 ==
                    (local_298->
                    super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                    super__Vector_impl_data._M_finish) {
                  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                            (local_298);
                  pCVar21 = (pvVar6->
                            super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                            _M_impl.super__Vector_impl_data._M_finish;
                  local_2c8._0_8_ =
                       pCVar21[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  local_2c8._8_8_ =
                       pCVar21[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  unique0x00012000 =
                       pCVar21[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  pCVar21[-1].parents.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2f8._0_8_;
                  pCVar21[-1].parents.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2f8._8_8_;
                  pCVar21[-1].parents.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2f8._16_8_;
                  local_2f8._0_8_ = (pointer)0x0;
                  local_2f8._8_8_ = (pointer)0x0;
                  local_2f8._16_8_ = (pointer)0x0;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2c8);
                  ::std::__cxx11::string::operator=
                            ((string *)
                             &(pvVar6->
                              super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)
                              ._M_impl.super__Vector_impl_data._M_finish[-1].name,
                             (string *)&local_1f0);
                  pCVar21 = (pvVar6->
                            super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                            _M_impl.super__Vector_impl_data._M_finish;
                  local_2c8._0_8_ =
                       pCVar21[-1].inputs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  local_2c8._8_8_ =
                       pCVar21[-1].inputs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  unique0x00012000 =
                       pCVar21[-1].inputs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  pCVar21[-1].inputs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  pCVar21[-1].inputs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  pCVar21[-1].inputs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2c8);
                }
                else {
                  pbVar18 = (pCVar21->inputs).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  if ((((0x20 < (ulong)((long)pbVar18 -
                                       (long)(pCVar21->inputs).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)) &&
                       (0x20 < (ulong)((long)local_288.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_288.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start))) ||
                      (local_2a0->allowMultipleDuplicateFields == true)) &&
                     ((((pbVar18[-1]._M_string_length != 0 &&
                        ((local_288.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_string_length != 0)) &&
                       (iVar11 = ::std::__cxx11::string::compare((char *)(pbVar18 + -1)),
                       iVar11 != 0)) &&
                      (iVar11 = ::std::__cxx11::string::compare
                                          ((char *)local_288.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start),
                      iVar11 != 0)))) {
                    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char_const(&)[3]>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &pCVar21->inputs,(char (*) [3])"%%");
                    pCVar21->multiline = true;
                  }
                  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &pCVar21->inputs,
                             (pCVar21->inputs).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             local_288.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             local_288.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                }
              }
              else if (((local_2f8._0_8_ != local_2f8._8_8_) &&
                       (__n = *(size_type *)(local_2f8._0_8_ + 8), __n == sVar3)) &&
                      ((__n == 0 ||
                       (iVar11 = bcmp(((_Alloc_hider *)local_2f8._0_8_)->_M_p,
                                      (local_2a0->configSection)._M_dataplus._M_p,__n), iVar11 == 0)
                       ))) {
                sVar2 = local_2a0->configIndex;
                if (local_214 == sVar2 || sVar2 < 0) {
                  local_23c = (uint)CONCAT71((uint7)(uint3)(int3)(char)((ushort)sVar2 >> 8),1);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_2f8,(iterator)uVar17);
                  goto LAB_001140dc;
                }
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2f8);
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_288);
  } while( true );
}

Assistant:

inline std::vector<ConfigItem> ConfigBase::from_config(std::istream &input) const {
    std::string line;
    std::string buffer;
    std::string currentSection = "default";
    std::string previousSection = "default";
    std::vector<ConfigItem> output;
    bool isDefaultArray = (arrayStart == '[' && arrayEnd == ']' && arraySeparator == ',');
    bool isINIArray = (arrayStart == '\0' || arrayStart == ' ') && arrayStart == arrayEnd;
    bool inSection{false};
    bool inMLineComment{false};
    bool inMLineValue{false};

    char aStart = (isINIArray) ? '[' : arrayStart;
    char aEnd = (isINIArray) ? ']' : arrayEnd;
    char aSep = (isINIArray && arraySeparator == ' ') ? ',' : arraySeparator;
    int currentSectionIndex{0};

    std::string line_sep_chars{parentSeparatorChar, commentChar, valueDelimiter};
    while(getline(input, buffer)) {
        std::vector<std::string> items_buffer;
        std::string name;
        line = detail::trim_copy(buffer);
        std::size_t len = line.length();
        // lines have to be at least 3 characters to have any meaning to CLI just skip the rest
        if(len < 3) {
            continue;
        }
        if(line.compare(0, 3, multiline_string_quote) == 0 || line.compare(0, 3, multiline_literal_quote) == 0) {
            inMLineComment = true;
            auto cchar = line.front();
            while(inMLineComment) {
                if(getline(input, line)) {
                    detail::trim(line);
                } else {
                    break;
                }
                if(detail::hasMLString(line, cchar)) {
                    inMLineComment = false;
                }
            }
            continue;
        }
        if(line.front() == '[' && line.back() == ']') {
            if(currentSection != "default") {
                // insert a section end which is just an empty items_buffer
                output.emplace_back();
                output.back().parents = detail::generate_parents(currentSection, name, parentSeparatorChar);
                output.back().name = "--";
            }
            currentSection = line.substr(1, len - 2);
            // deal with double brackets for TOML
            if(currentSection.size() > 1 && currentSection.front() == '[' && currentSection.back() == ']') {
                currentSection = currentSection.substr(1, currentSection.size() - 2);
            }
            if(detail::to_lower(currentSection) == "default") {
                currentSection = "default";
            } else {
                detail::checkParentSegments(output, currentSection, parentSeparatorChar);
            }
            inSection = false;
            if(currentSection == previousSection) {
                ++currentSectionIndex;
            } else {
                currentSectionIndex = 0;
                previousSection = currentSection;
            }
            continue;
        }

        // comment lines
        if(line.front() == ';' || line.front() == '#' || line.front() == commentChar) {
            continue;
        }
        std::size_t search_start = 0;
        if(line.find_first_of("\"'`") != std::string::npos) {
            while(search_start < line.size()) {
                auto test_char = line[search_start];
                if(test_char == '\"' || test_char == '\'' || test_char == '`') {
                    search_start = detail::close_sequence(line, search_start, line[search_start]);
                    ++search_start;
                } else if(test_char == valueDelimiter || test_char == commentChar) {
                    --search_start;
                    break;
                } else if(test_char == ' ' || test_char == '\t' || test_char == parentSeparatorChar) {
                    ++search_start;
                } else {
                    search_start = line.find_first_of(line_sep_chars, search_start);
                }
            }
        }
        // Find = in string, split and recombine
        auto delimiter_pos = line.find_first_of(valueDelimiter, search_start + 1);
        auto comment_pos = line.find_first_of(commentChar, search_start);
        if(comment_pos < delimiter_pos) {
            delimiter_pos = std::string::npos;
        }
        if(delimiter_pos != std::string::npos) {

            name = detail::trim_copy(line.substr(0, delimiter_pos));
            std::string item = detail::trim_copy(line.substr(delimiter_pos + 1, std::string::npos));
            bool mlquote =
                (item.compare(0, 3, multiline_literal_quote) == 0 || item.compare(0, 3, multiline_string_quote) == 0);
            if(!mlquote && comment_pos != std::string::npos) {
                auto citems = detail::split_up(item, commentChar);
                item = detail::trim_copy(citems.front());
            }
            if(mlquote) {
                // multiline string
                auto keyChar = item.front();
                item = buffer.substr(delimiter_pos + 1, std::string::npos);
                detail::ltrim(item);
                item.erase(0, 3);
                inMLineValue = true;
                bool lineExtension{false};
                bool firstLine = true;
                if(!item.empty() && item.back() == '\\') {
                    item.pop_back();
                    lineExtension = true;
                } else if(detail::hasMLString(item, keyChar)) {
                    // deal with the first line closing the multiline literal
                    item.pop_back();
                    item.pop_back();
                    item.pop_back();
                    if(keyChar == '\"') {
                        try {
                            item = detail::remove_escaped_characters(item);
                        } catch(const std::invalid_argument &iarg) {
                            throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
                        }
                    }
                    inMLineValue = false;
                }
                while(inMLineValue) {
                    std::string l2;
                    if(!std::getline(input, l2)) {
                        break;
                    }
                    line = l2;
                    detail::rtrim(line);
                    if(detail::hasMLString(line, keyChar)) {
                        line.pop_back();
                        line.pop_back();
                        line.pop_back();
                        if(lineExtension) {
                            detail::ltrim(line);
                        } else if(!(firstLine && item.empty())) {
                            item.push_back('\n');
                        }
                        firstLine = false;
                        item += line;
                        inMLineValue = false;
                        if(!item.empty() && item.back() == '\n') {
                            item.pop_back();
                        }
                        if(keyChar == '\"') {
                            try {
                                item = detail::remove_escaped_characters(item);
                            } catch(const std::invalid_argument &iarg) {
                                throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
                            }
                        }
                    } else {
                        if(lineExtension) {
                            detail::trim(l2);
                        } else if(!(firstLine && item.empty())) {
                            item.push_back('\n');
                        }
                        lineExtension = false;
                        firstLine = false;
                        if(!l2.empty() && l2.back() == '\\') {
                            lineExtension = true;
                            l2.pop_back();
                        }
                        item += l2;
                    }
                }
                items_buffer = {item};
            } else if(item.size() > 1 && item.front() == aStart) {
                for(std::string multiline; item.back() != aEnd && std::getline(input, multiline);) {
                    detail::trim(multiline);
                    item += multiline;
                }
                if(item.back() == aEnd) {
                    items_buffer = detail::split_up(item.substr(1, item.length() - 2), aSep);
                } else {
                    items_buffer = detail::split_up(item.substr(1, std::string::npos), aSep);
                }
            } else if((isDefaultArray || isINIArray) && item.find_first_of(aSep) != std::string::npos) {
                items_buffer = detail::split_up(item, aSep);
            } else if((isDefaultArray || isINIArray) && item.find_first_of(' ') != std::string::npos) {
                items_buffer = detail::split_up(item, '\0');
            } else {
                items_buffer = {item};
            }
        } else {
            name = detail::trim_copy(line.substr(0, comment_pos));
            items_buffer = {"true"};
        }
        std::vector<std::string> parents;
        try {
            parents = detail::generate_parents(currentSection, name, parentSeparatorChar);
            detail::process_quoted_string(name);
            // clean up quotes on the items and check for escaped strings
            for(auto &it : items_buffer) {
                detail::process_quoted_string(it, stringQuote, literalQuote);
            }
        } catch(const std::invalid_argument &ia) {
            throw CLI::ParseError(ia.what(), CLI::ExitCodes::InvalidError);
        }

        if(parents.size() > maximumLayers) {
            continue;
        }
        if(!configSection.empty() && !inSection) {
            if(parents.empty() || parents.front() != configSection) {
                continue;
            }
            if(configIndex >= 0 && currentSectionIndex != configIndex) {
                continue;
            }
            parents.erase(parents.begin());
            inSection = true;
        }
        auto match = detail::find_matching_config(output, parents, name, allowMultipleDuplicateFields);
        if(match != output.end()) {
            if((match->inputs.size() > 1 && items_buffer.size() > 1) || allowMultipleDuplicateFields) {
                // insert a separator if one is not already present
                if(!(match->inputs.back().empty() || items_buffer.front().empty() || match->inputs.back() == "%%" ||
                     items_buffer.front() == "%%")) {
                    match->inputs.emplace_back("%%");
                    match->multiline = true;
                }
            }
            match->inputs.insert(match->inputs.end(), items_buffer.begin(), items_buffer.end());
        } else {
            output.emplace_back();
            output.back().parents = std::move(parents);
            output.back().name = std::move(name);
            output.back().inputs = std::move(items_buffer);
        }
    }
    if(currentSection != "default") {
        // insert a section end which is just an empty items_buffer
        std::string ename;
        output.emplace_back();
        output.back().parents = detail::generate_parents(currentSection, ename, parentSeparatorChar);
        output.back().name = "--";
        while(output.back().parents.size() > 1) {
            output.push_back(output.back());
            output.back().parents.pop_back();
        }
    }
    return output;
}